

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

Simd128ConstOpnd * __thiscall
IR::Simd128ConstOpnd::New(Simd128ConstOpnd *this,AsmJsSIMDValue value,IRType type,Func *func)

{
  Simd128ConstOpnd *this_00;
  undefined7 in_register_00000009;
  
  this_00 = (Simd128ConstOpnd *)
            new<Memory::JitArenaAllocator>
                      (0x20,*(JitArenaAllocator **)CONCAT71(in_register_00000009,type),0x3d6ef4);
  (this_00->super_Opnd)._vptr_Opnd = (_func_int **)0x0;
  (this_00->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (this_00->super_Opnd).m_type = TyIllegal;
  (this_00->super_Opnd).field_0xb = 0;
  (this_00->super_Opnd).m_kind = OpndKindInvalid;
  (this_00->super_Opnd).isDeleted = false;
  *(undefined2 *)&(this_00->super_Opnd).field_0xe = 0;
  (this_00->m_value).field_0.f64[0] = 0.0;
  (this_00->m_value).field_0.f64[1] = 0.0;
  Simd128ConstOpnd(this_00);
  (this_00->m_value).field_0.f64[0] = (Type)this;
  (this_00->m_value).field_0.i64[1] = value.field_0._0_8_;
  (this_00->super_Opnd).m_type = value.field_0._8_1_;
  (this_00->super_Opnd).m_kind = OpndKindSimd128Const;
  return this_00;
}

Assistant:

Simd128ConstOpnd *
Simd128ConstOpnd::New(AsmJsSIMDValue value, IRType type, Func *func)
{
    Simd128ConstOpnd * simd128ConstOpnd;

    simd128ConstOpnd = JitAnew(func->m_alloc, IR::Simd128ConstOpnd);

    simd128ConstOpnd->m_value = value;
    simd128ConstOpnd->m_type = type;

    simd128ConstOpnd->m_kind = OpndKindSimd128Const;


    return simd128ConstOpnd;
}